

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O2

void __thiscall DArgs::CollectFiles(DArgs *this,char *param,char *extension)

{
  TArray<FString,_FString> *this_00;
  char cVar1;
  FString *pFVar2;
  char *pcVar3;
  int iVar4;
  uint index;
  TArray<FString,_FString> work;
  ulong local_48;
  FString local_40;
  char *local_38;
  
  work.Array = (FString *)0x0;
  work.Most = 0;
  work.Count = 0;
  local_38 = extension;
  if (extension == (char *)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = strlen(extension);
  }
  this_00 = &this->Argv;
  index = 1;
LAB_003b5120:
  do {
    if ((this->Argv).Count <= index) break;
    pFVar2 = this_00->Array;
    pcVar3 = pFVar2[index].Chars;
    if ((*pcVar3 == '+') || (*pcVar3 == '-')) break;
    if (local_48 != 0) {
      if (*(uint *)(pcVar3 + -0xc) < local_48) goto LAB_003b518b;
      iVar4 = strcasecmp(pcVar3 + (*(uint *)(pcVar3 + -0xc) - local_48),local_38);
      if (iVar4 != 0) goto LAB_003b518b;
    }
    TArray<FString,_FString>::Push(&work,pFVar2 + index);
    TArray<FString,_FString>::Delete(this_00,index);
  } while( true );
LAB_003b519e:
  while ((this->Argv).Count <= index) {
LAB_003b51ce:
    index = CheckParm(this,param,index);
    if (index == 0) {
      if (work.Count != 0) {
        FString::FString(&local_40,param);
        TArray<FString,_FString>::Push(this_00,&local_40);
        FString::~FString(&local_40);
        AppendArgs(this,work.Count,work.Array);
      }
      TArray<FString,_FString>::~TArray(&work);
      return;
    }
    TArray<FString,_FString>::Delete(this_00,index);
  }
  cVar1 = *this_00->Array[index].Chars;
  if ((cVar1 == '+') || (cVar1 == '-')) goto LAB_003b51ce;
  TArray<FString,_FString>::Push(&work,this_00->Array + index);
  TArray<FString,_FString>::Delete(this_00,index);
  goto LAB_003b519e;
LAB_003b518b:
  index = index + 1;
  goto LAB_003b5120;
}

Assistant:

void DArgs::CollectFiles(const char *param, const char *extension)
{
	TArray<FString> work;
	unsigned int i;
	size_t extlen = extension == NULL ? 0 : strlen(extension);

	// Step 1: Find suitable arguments before the first switch.
	i = 1;
	while (i < Argv.Size() && Argv[i][0] != '-' && Argv[i][0] != '+')
	{
		bool useit;

		if (extlen > 0)
		{ // Argument's extension must match.
			size_t len = Argv[i].Len();
			useit = (len >= extlen && stricmp(&Argv[i][len - extlen], extension) == 0);
		}
		else
		{ // Anything will do so long as it's before the first switch.
			useit = true;
		}
		if (useit)
		{
			work.Push(Argv[i]);
			Argv.Delete(i);
		}
		else
		{
			i++;
		}
	}

	// Step 2: Find each occurence of -param and add its arguments to work.
	while ((i = CheckParm(param, i)) > 0)
	{
		Argv.Delete(i);
		while (i < Argv.Size() && Argv[i][0] != '-' && Argv[i][0] != '+')
		{
			work.Push(Argv[i]);
			Argv.Delete(i);
		}
	}

	// Optional: Replace short path names with long path names
#ifdef _WIN32
	for (i = 0; i < work.Size(); ++i)
	{
		work[i] = I_GetLongPathName(work[i]);
	}
#endif

	// Step 3: Add work back to Argv, as long as it's non-empty.
	if (work.Size() > 0)
	{
		Argv.Push(param);
		AppendArgs(work.Size(), &work[0]);
	}
}